

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::avx::ConeCurveMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  byte bVar92;
  Scene *pSVar93;
  bool bVar94;
  uint uVar95;
  undefined4 uVar96;
  ulong uVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar115;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar119;
  undefined1 auVar118 [32];
  float fVar120;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar128 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar129 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  float fVar136;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  float fVar151;
  float fVar152;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar162;
  float fVar171;
  float fVar173;
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar163;
  undefined1 auVar166 [32];
  float fVar172;
  float fVar174;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar188;
  float fVar189;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar190;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar214 [28];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  float fVar217;
  float fVar221;
  float fVar222;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar223 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  Scene *scene;
  RoundLineIntersectorHitM<8> hit;
  int local_5fc;
  RayQueryContext *local_5f8;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  uint local_5dc;
  uint local_5d8;
  uint local_5d4;
  uint local_5d0;
  RTCFilterFunctionNArguments local_5c0;
  Primitive *local_590;
  Scene *local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined4 uStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined4 uStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  local_5f8 = context;
  pSVar93 = context->scene;
  uVar95 = (line->v0).field_0.i[0];
  local_588 = pSVar93;
  pGVar9 = (pSVar93->geometries).items[line->sharedGeomID].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar2 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[2];
  uVar4 = (line->v0).field_0.i[4];
  uVar5 = (line->v0).field_0.i[5];
  auVar101._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar4 * (long)p_Var11);
  auVar101._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar95 * (long)p_Var11);
  auVar110._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  auVar110._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar2 * (long)p_Var11);
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[6];
  auVar116._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar116._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar3 * (long)p_Var11);
  uVar8 = (line->v0).field_0.i[7];
  auVar121._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar8 * (long)p_Var11);
  auVar121._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar183._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar183._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar95 + 1) * (long)p_Var11);
  auVar191._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar191._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar2 + 1) * (long)p_Var11);
  auVar134 = vunpcklps_avx(auVar101,auVar116);
  auVar168 = vunpckhps_avx(auVar101,auVar116);
  auVar143 = vunpcklps_avx(auVar110,auVar121);
  auVar219 = vunpckhps_avx(auVar110,auVar121);
  auVar57 = vunpcklps_avx(auVar134,auVar143);
  auVar205 = vunpckhps_avx(auVar134,auVar143);
  auVar58 = vunpcklps_avx(auVar168,auVar219);
  auVar101 = vunpckhps_avx(auVar168,auVar219);
  auVar102._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar102._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar111._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar111._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar134 = vunpcklps_avx(auVar183,auVar102);
  auVar168 = vunpckhps_avx(auVar183,auVar102);
  auVar143 = vunpcklps_avx(auVar191,auVar111);
  auVar219 = vunpckhps_avx(auVar191,auVar111);
  auVar111 = vunpcklps_avx(auVar134,auVar143);
  auVar102 = vunpckhps_avx(auVar134,auVar143);
  auVar116 = vunpcklps_avx(auVar168,auVar219);
  auVar110 = vunpckhps_avx(auVar168,auVar219);
  auVar129 = vpcmpeqd_avx(auVar110._0_16_,auVar110._0_16_);
  auVar56 = vpcmpeqd_avx(auVar129,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  local_590 = line;
  auVar129 = vpcmpeqd_avx(auVar129,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_290 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  local_2a0 = local_290;
  uVar97 = *(ulong *)((long)&(ray->dir).field_0 + 4);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar97;
  aVar1 = (ray->dir).field_0;
  auVar128 = vshufps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0xee);
  fVar98 = (float)uVar97;
  fVar152 = (ray->dir).field_0.m128[0];
  auVar128 = ZEXT416((uint)(fVar152 * fVar152 + fVar98 * fVar98 + auVar128._0_4_ * auVar128._0_4_));
  auVar128 = vshufps_avx(auVar128,auVar128,0);
  auVar130._16_16_ = auVar128;
  auVar130._0_16_ = auVar128;
  auVar168 = vrcpps_avx(auVar130);
  auVar112._16_16_ = auVar129;
  auVar112._0_16_ = auVar56;
  fVar162 = auVar168._0_4_;
  fVar171 = auVar168._4_4_;
  auVar219._4_4_ = fVar171 * auVar128._4_4_;
  auVar219._0_4_ = fVar162 * auVar128._0_4_;
  fVar173 = auVar168._8_4_;
  auVar219._8_4_ = fVar173 * auVar128._8_4_;
  fVar175 = auVar168._12_4_;
  auVar219._12_4_ = fVar175 * auVar128._12_4_;
  fVar177 = auVar168._16_4_;
  auVar219._16_4_ = fVar177 * auVar128._0_4_;
  fVar179 = auVar168._20_4_;
  auVar219._20_4_ = fVar179 * auVar128._4_4_;
  fVar181 = auVar168._24_4_;
  auVar219._24_4_ = fVar181 * auVar128._8_4_;
  auVar219._28_4_ = auVar129._12_4_;
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar219 = vsubps_avx(auVar117,auVar219);
  fVar115 = auVar168._28_4_ + auVar219._28_4_;
  auVar143._4_4_ = (auVar111._4_4_ + auVar57._4_4_) * 0.5;
  auVar143._0_4_ = (auVar111._0_4_ + auVar57._0_4_) * 0.5;
  auVar143._8_4_ = (auVar111._8_4_ + auVar57._8_4_) * 0.5;
  auVar143._12_4_ = (auVar111._12_4_ + auVar57._12_4_) * 0.5;
  auVar143._16_4_ = (auVar111._16_4_ + auVar57._16_4_) * 0.5;
  auVar143._20_4_ = (auVar111._20_4_ + auVar57._20_4_) * 0.5;
  auVar143._24_4_ = (auVar111._24_4_ + auVar57._24_4_) * 0.5;
  auVar143._28_4_ = auVar111._28_4_ + auVar57._28_4_;
  auVar168._4_4_ = (auVar205._4_4_ + auVar102._4_4_) * 0.5;
  auVar168._0_4_ = (auVar205._0_4_ + auVar102._0_4_) * 0.5;
  auVar168._8_4_ = (auVar205._8_4_ + auVar102._8_4_) * 0.5;
  auVar168._12_4_ = (auVar205._12_4_ + auVar102._12_4_) * 0.5;
  auVar168._16_4_ = (auVar205._16_4_ + auVar102._16_4_) * 0.5;
  auVar168._20_4_ = (auVar205._20_4_ + auVar102._20_4_) * 0.5;
  auVar168._24_4_ = (auVar205._24_4_ + auVar102._24_4_) * 0.5;
  auVar168._28_4_ = auVar205._28_4_ + auVar102._28_4_;
  auVar134._4_4_ = (auVar116._4_4_ + auVar58._4_4_) * 0.5;
  auVar134._0_4_ = (auVar116._0_4_ + auVar58._0_4_) * 0.5;
  auVar134._8_4_ = (auVar116._8_4_ + auVar58._8_4_) * 0.5;
  auVar134._12_4_ = (auVar116._12_4_ + auVar58._12_4_) * 0.5;
  auVar134._16_4_ = (auVar116._16_4_ + auVar58._16_4_) * 0.5;
  auVar134._20_4_ = (auVar116._20_4_ + auVar58._20_4_) * 0.5;
  auVar134._24_4_ = (auVar116._24_4_ + auVar58._24_4_) * 0.5;
  auVar134._28_4_ = 0x3f000000;
  auVar129 = vshufps_avx(auVar100,auVar100,0);
  register0x00001350 = auVar129;
  _local_180 = auVar129;
  auVar56 = vshufps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0xaa);
  fVar152 = (ray->org).field_0.m128[1];
  auVar122._4_4_ = fVar152;
  auVar122._0_4_ = fVar152;
  auVar122._8_4_ = fVar152;
  auVar122._12_4_ = fVar152;
  auVar122._16_4_ = fVar152;
  auVar122._20_4_ = fVar152;
  auVar122._24_4_ = fVar152;
  auVar122._28_4_ = fVar152;
  local_380._16_16_ = auVar56;
  local_380._0_16_ = auVar56;
  auVar168 = vsubps_avx(auVar168,auVar122);
  fVar98 = (ray->org).field_0.m128[2];
  auVar131._4_4_ = fVar98;
  auVar131._0_4_ = fVar98;
  auVar131._8_4_ = fVar98;
  auVar131._12_4_ = fVar98;
  auVar131._16_4_ = fVar98;
  auVar131._20_4_ = fVar98;
  auVar131._24_4_ = fVar98;
  auVar131._28_4_ = fVar98;
  auVar134 = vsubps_avx(auVar134,auVar131);
  fVar217 = auVar56._0_4_;
  fVar221 = auVar56._4_4_;
  fVar222 = auVar56._8_4_;
  fStack_344 = auVar56._12_4_;
  fVar189 = auVar129._0_4_;
  fVar13 = auVar129._4_4_;
  fVar19 = auVar129._8_4_;
  fVar27 = auVar129._12_4_;
  fVar188 = (ray->org).field_0.m128[0];
  auVar164._4_4_ = fVar188;
  auVar164._0_4_ = fVar188;
  auVar164._8_4_ = fVar188;
  auVar164._12_4_ = fVar188;
  auVar164._16_4_ = fVar188;
  auVar164._20_4_ = fVar188;
  auVar164._24_4_ = fVar188;
  auVar164._28_4_ = fVar188;
  local_2c0 = (ray->dir).field_0.m128[0];
  auVar143 = vsubps_avx(auVar143,auVar164);
  fStack_144 = auVar143._28_4_;
  local_160 = (local_2c0 * auVar143._0_4_ + auVar168._0_4_ * fVar189 + fVar217 * auVar134._0_4_) *
              (fVar162 + fVar162 * auVar219._0_4_);
  fStack_15c = (local_2c0 * auVar143._4_4_ + auVar168._4_4_ * fVar13 + fVar221 * auVar134._4_4_) *
               (fVar171 + fVar171 * auVar219._4_4_);
  fStack_158 = (local_2c0 * auVar143._8_4_ + auVar168._8_4_ * fVar19 + fVar222 * auVar134._8_4_) *
               (fVar173 + fVar173 * auVar219._8_4_);
  fStack_154 = (local_2c0 * auVar143._12_4_ +
               auVar168._12_4_ * fVar27 + fStack_344 * auVar134._12_4_) *
               (fVar175 + fVar175 * auVar219._12_4_);
  fStack_150 = (local_2c0 * auVar143._16_4_ + auVar168._16_4_ * fVar189 + fVar217 * auVar134._16_4_)
               * (fVar177 + fVar177 * auVar219._16_4_);
  fStack_14c = (local_2c0 * auVar143._20_4_ + auVar168._20_4_ * fVar13 + fVar221 * auVar134._20_4_)
               * (fVar179 + fVar179 * auVar219._20_4_);
  fStack_148 = (local_2c0 * auVar143._24_4_ + auVar168._24_4_ * fVar19 + fVar222 * auVar134._24_4_)
               * (fVar181 + fVar181 * auVar219._24_4_);
  auVar199._0_4_ = fVar188 + local_2c0 * local_160;
  auVar199._4_4_ = fVar188 + local_2c0 * fStack_15c;
  auVar199._8_4_ = fVar188 + local_2c0 * fStack_158;
  auVar199._12_4_ = fVar188 + local_2c0 * fStack_154;
  auVar199._16_4_ = fVar188 + local_2c0 * fStack_150;
  auVar199._20_4_ = fVar188 + local_2c0 * fStack_14c;
  auVar199._24_4_ = fVar188 + local_2c0 * fStack_148;
  auVar199._28_4_ = fVar188 + fStack_144 + auVar168._28_4_ + auVar134._28_4_;
  auVar153._0_4_ = fVar152 + fVar189 * local_160;
  auVar153._4_4_ = fVar152 + fVar13 * fStack_15c;
  auVar153._8_4_ = fVar152 + fVar19 * fStack_158;
  auVar153._12_4_ = fVar152 + fVar27 * fStack_154;
  auVar153._16_4_ = fVar152 + fVar189 * fStack_150;
  auVar153._20_4_ = fVar152 + fVar13 * fStack_14c;
  auVar153._24_4_ = fVar152 + fVar19 * fStack_148;
  auVar153._28_4_ = fVar152 + fVar115;
  auVar103._0_4_ = fVar98 + fVar217 * local_160;
  auVar103._4_4_ = fVar98 + fVar221 * fStack_15c;
  auVar103._8_4_ = fVar98 + fVar222 * fStack_158;
  auVar103._12_4_ = fVar98 + fStack_344 * fStack_154;
  auVar103._16_4_ = fVar98 + fVar217 * fStack_150;
  auVar103._20_4_ = fVar98 + fVar221 * fStack_14c;
  auVar103._24_4_ = fVar98 + fVar222 * fStack_148;
  auVar103._28_4_ = fVar98 + fVar115;
  local_3a0 = vsubps_avx(auVar102,auVar205);
  local_3c0 = vsubps_avx(auVar116,auVar58);
  fVar98 = local_3c0._0_4_;
  fVar179 = local_3c0._4_4_;
  fVar20 = local_3c0._8_4_;
  fVar28 = local_3c0._12_4_;
  fVar35 = local_3c0._16_4_;
  fVar42 = local_3c0._20_4_;
  fVar49 = local_3c0._24_4_;
  fVar188 = local_3a0._0_4_;
  fVar181 = local_3a0._4_4_;
  fVar21 = local_3a0._8_4_;
  fVar29 = local_3a0._12_4_;
  fVar36 = local_3a0._16_4_;
  fVar43 = local_3a0._20_4_;
  fVar50 = local_3a0._24_4_;
  local_420 = vsubps_avx(auVar111,auVar57);
  fVar162 = local_420._0_4_;
  fVar14 = local_420._4_4_;
  fVar22 = local_420._8_4_;
  fVar30 = local_420._12_4_;
  fVar37 = local_420._16_4_;
  fVar44 = local_420._20_4_;
  fVar51 = local_420._24_4_;
  local_460._0_4_ = fVar162 * fVar162 + fVar188 * fVar188 + fVar98 * fVar98;
  local_460._4_4_ = fVar14 * fVar14 + fVar181 * fVar181 + fVar179 * fVar179;
  fStack_458 = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
  fStack_454 = fVar30 * fVar30 + fVar29 * fVar29 + fVar28 * fVar28;
  fStack_450 = fVar37 * fVar37 + fVar36 * fVar36 + fVar35 * fVar35;
  fStack_44c = fVar44 * fVar44 + fVar43 * fVar43 + fVar42 * fVar42;
  fStack_448 = fVar51 * fVar51 + fVar50 * fVar50 + fVar49 * fVar49;
  local_3e0 = vsubps_avx(auVar153,auVar205);
  local_400 = vsubps_avx(auVar103,auVar58);
  fVar171 = local_400._0_4_;
  fVar15 = local_400._4_4_;
  fVar23 = local_400._8_4_;
  fVar31 = local_400._12_4_;
  fVar38 = local_400._16_4_;
  fVar45 = local_400._20_4_;
  fVar52 = local_400._24_4_;
  fVar173 = local_3e0._0_4_;
  fVar16 = local_3e0._4_4_;
  fVar24 = local_3e0._8_4_;
  fVar32 = local_3e0._12_4_;
  fVar39 = local_3e0._16_4_;
  fVar46 = local_3e0._20_4_;
  fVar53 = local_3e0._24_4_;
  fVar120 = auVar58._28_4_;
  local_580 = vsubps_avx(auVar199,auVar57);
  fVar175 = local_580._0_4_;
  fVar17 = local_580._4_4_;
  fVar25 = local_580._8_4_;
  fVar33 = local_580._12_4_;
  fVar40 = local_580._16_4_;
  fVar47 = local_580._20_4_;
  fVar54 = local_580._24_4_;
  fVar203 = fVar162 * fVar175 + fVar188 * fVar173 + fVar98 * fVar171;
  fVar207 = fVar14 * fVar17 + fVar181 * fVar16 + fVar179 * fVar15;
  fVar208 = fVar22 * fVar25 + fVar21 * fVar24 + fVar20 * fVar23;
  fVar209 = fVar30 * fVar33 + fVar29 * fVar32 + fVar28 * fVar31;
  fVar210 = fVar37 * fVar40 + fVar36 * fVar39 + fVar35 * fVar38;
  fVar211 = fVar44 * fVar47 + fVar43 * fVar46 + fVar42 * fVar45;
  fVar212 = fVar51 * fVar54 + fVar50 * fVar53 + fVar49 * fVar52;
  fVar213 = fVar120 + fVar120 + fStack_144;
  fVar119 = fVar120 + fVar120 + fStack_144;
  auVar201._0_4_ = fVar162 * local_2c0 + fVar188 * fVar189 + fVar98 * fVar217;
  auVar201._4_4_ = fVar14 * local_2c0 + fVar181 * fVar13 + fVar179 * fVar221;
  auVar201._8_4_ = fVar22 * local_2c0 + fVar21 * fVar19 + fVar20 * fVar222;
  auVar201._12_4_ = fVar30 * local_2c0 + fVar29 * fVar27 + fVar28 * fStack_344;
  auVar201._16_4_ = fVar37 * local_2c0 + fVar36 * fVar189 + fVar35 * fVar217;
  auVar201._20_4_ = fVar44 * local_2c0 + fVar43 * fVar13 + fVar42 * fVar221;
  auVar201._24_4_ = fVar51 * local_2c0 + fVar50 * fVar19 + fVar49 * fVar222;
  auVar201._28_4_ = fVar120 + fVar119;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  auVar117 = local_580;
  auVar168 = vsubps_avx(auVar101,auVar110);
  fVar177 = auVar168._0_4_;
  fVar18 = auVar168._4_4_;
  fVar26 = auVar168._8_4_;
  fVar34 = auVar168._12_4_;
  fVar41 = auVar168._16_4_;
  fVar48 = auVar168._20_4_;
  fVar55 = auVar168._24_4_;
  fVar99 = fVar177 * fVar177 + (float)local_460._0_4_;
  fVar104 = fVar18 * fVar18 + (float)local_460._4_4_;
  fVar105 = fVar26 * fVar26 + fStack_458;
  fVar106 = fVar34 * fVar34 + fStack_454;
  fVar107 = fVar41 * fVar41 + fStack_450;
  fVar108 = fVar48 * fVar48 + fStack_44c;
  fVar109 = fVar55 * fVar55 + fStack_448;
  fVar136 = (float)local_460._0_4_ * (float)local_460._0_4_;
  fVar145 = (float)local_460._4_4_ * (float)local_460._4_4_;
  local_1a0._4_4_ = fVar145;
  local_1a0._0_4_ = fVar136;
  fVar146 = fStack_458 * fStack_458;
  fStack_198 = fVar146;
  fVar147 = fStack_454 * fStack_454;
  fStack_194 = fVar147;
  fVar148 = fStack_450 * fStack_450;
  fStack_190 = fVar148;
  fVar149 = fStack_44c * fStack_44c;
  fStack_18c = fVar149;
  fVar150 = fStack_448 * fStack_448;
  fStack_188 = fVar150;
  uStack_184 = fVar27;
  auVar205._4_4_ = fVar145 * (local_2c0 * fVar17 + fVar13 * fVar16 + fVar221 * fVar15);
  auVar205._0_4_ = fVar136 * (local_2c0 * fVar175 + fVar189 * fVar173 + fVar217 * fVar171);
  auVar205._8_4_ = fVar146 * (local_2c0 * fVar25 + fVar19 * fVar24 + fVar222 * fVar23);
  auVar205._12_4_ = fVar147 * (local_2c0 * fVar33 + fVar27 * fVar32 + fStack_344 * fVar31);
  auVar205._16_4_ = fVar148 * (local_2c0 * fVar40 + fVar189 * fVar39 + fVar217 * fVar38);
  auVar205._20_4_ = fVar149 * (local_2c0 * fVar47 + fVar13 * fVar46 + fVar221 * fVar45);
  auVar205._24_4_ = fVar150 * (local_2c0 * fVar54 + fVar19 * fVar53 + fVar222 * fVar52);
  auVar205._28_4_ = fVar120 + fVar120 + fVar119;
  fVar119 = local_400._28_4_;
  auVar57._4_4_ = fVar104 * auVar201._4_4_ * fVar207;
  auVar57._0_4_ = fVar99 * auVar201._0_4_ * fVar203;
  auVar57._8_4_ = fVar105 * auVar201._8_4_ * fVar208;
  auVar57._12_4_ = fVar106 * auVar201._12_4_ * fVar209;
  auVar57._16_4_ = fVar107 * auVar201._16_4_ * fVar210;
  auVar57._20_4_ = fVar108 * auVar201._20_4_ * fVar211;
  auVar57._24_4_ = fVar109 * auVar201._24_4_ * fVar212;
  auVar57._28_4_ = fVar119;
  auVar219 = vsubps_avx(auVar205,auVar57);
  fStack_444 = auVar111._28_4_ + fVar152 + fVar115;
  fVar163 = auVar101._0_4_;
  fVar151 = fVar163 * (float)local_460._0_4_;
  fVar172 = auVar101._4_4_;
  fVar156 = fVar172 * (float)local_460._4_4_;
  auVar58._4_4_ = fVar156;
  auVar58._0_4_ = fVar151;
  fVar174 = auVar101._8_4_;
  fVar157 = fVar174 * fStack_458;
  auVar58._8_4_ = fVar157;
  fVar176 = auVar101._12_4_;
  fVar158 = fVar176 * fStack_454;
  auVar58._12_4_ = fVar158;
  fVar178 = auVar101._16_4_;
  fVar159 = fVar178 * fStack_450;
  auVar58._16_4_ = fVar159;
  fVar180 = auVar101._20_4_;
  fVar160 = fVar180 * fStack_44c;
  auVar58._20_4_ = fVar160;
  fVar182 = auVar101._24_4_;
  fVar161 = fVar182 * fStack_448;
  auVar58._24_4_ = fVar161;
  auVar58._28_4_ = fVar119;
  auVar165._0_4_ = fVar151 * fVar177 * auVar201._0_4_ + auVar219._0_4_;
  auVar165._4_4_ = fVar156 * fVar18 * auVar201._4_4_ + auVar219._4_4_;
  auVar165._8_4_ = fVar157 * fVar26 * auVar201._8_4_ + auVar219._8_4_;
  auVar165._12_4_ = fVar158 * fVar34 * auVar201._12_4_ + auVar219._12_4_;
  auVar165._16_4_ = fVar159 * fVar41 * auVar201._16_4_ + auVar219._16_4_;
  auVar165._20_4_ = fVar160 * fVar48 * auVar201._20_4_ + auVar219._20_4_;
  auVar165._24_4_ = fVar161 * fVar55 * auVar201._24_4_ + auVar219._24_4_;
  auVar165._28_4_ = auVar101._28_4_ + auVar219._28_4_;
  auVar59._4_4_ = fVar145 * (fVar17 * fVar17 + fVar16 * fVar16 + fVar15 * fVar15);
  auVar59._0_4_ = fVar136 * (fVar175 * fVar175 + fVar173 * fVar173 + fVar171 * fVar171);
  auVar59._8_4_ = fVar146 * (fVar25 * fVar25 + fVar24 * fVar24 + fVar23 * fVar23);
  auVar59._12_4_ = fVar147 * (fVar33 * fVar33 + fVar32 * fVar32 + fVar31 * fVar31);
  auVar59._16_4_ = fVar148 * (fVar40 * fVar40 + fVar39 * fVar39 + fVar38 * fVar38);
  auVar59._20_4_ = fVar149 * (fVar47 * fVar47 + fVar46 * fVar46 + fVar45 * fVar45);
  auVar59._24_4_ = fVar150 * (fVar54 * fVar54 + fVar53 * fVar53 + fVar52 * fVar52);
  auVar59._28_4_ = auVar219._28_4_;
  auVar60._4_4_ = fVar104 * fVar207 * fVar207;
  auVar60._0_4_ = fVar99 * fVar203 * fVar203;
  auVar60._8_4_ = fVar105 * fVar208 * fVar208;
  auVar60._12_4_ = fVar106 * fVar209 * fVar209;
  auVar60._16_4_ = fVar107 * fVar210 * fVar210;
  auVar60._20_4_ = fVar108 * fVar211 * fVar211;
  auVar60._24_4_ = fVar109 * fVar212 * fVar212;
  auVar60._28_4_ = fVar27 + fVar27 + fVar120;
  auVar219 = vsubps_avx(auVar59,auVar60);
  auVar61._4_4_ = fVar207 * (fVar18 + fVar18);
  auVar61._0_4_ = fVar203 * (fVar177 + fVar177);
  auVar61._8_4_ = fVar208 * (fVar26 + fVar26);
  auVar61._12_4_ = fVar209 * (fVar34 + fVar34);
  auVar61._16_4_ = fVar210 * (fVar41 + fVar41);
  auVar61._20_4_ = fVar211 * (fVar48 + fVar48);
  auVar61._24_4_ = fVar212 * (fVar55 + fVar55);
  auVar61._28_4_ = auVar168._28_4_ + auVar168._28_4_;
  auVar168 = vsubps_avx(auVar61,auVar58);
  fVar152 = auVar168._28_4_;
  fVar120 = auVar201._0_4_ * auVar201._0_4_;
  fVar115 = auVar201._4_4_ * auVar201._4_4_;
  fVar123 = auVar201._8_4_ * auVar201._8_4_;
  fVar124 = auVar201._12_4_ * auVar201._12_4_;
  fVar125 = auVar201._16_4_ * auVar201._16_4_;
  fVar126 = auVar201._20_4_ * auVar201._20_4_;
  fVar127 = auVar201._24_4_ * auVar201._24_4_;
  auVar62._4_4_ = fVar104 * fVar115;
  auVar62._0_4_ = fVar99 * fVar120;
  auVar62._8_4_ = fVar105 * fVar123;
  auVar62._12_4_ = fVar106 * fVar124;
  auVar62._16_4_ = fVar107 * fVar125;
  auVar62._20_4_ = fVar108 * fVar126;
  auVar62._24_4_ = fVar109 * fVar127;
  auVar62._28_4_ = fVar152;
  auVar134 = vsubps_avx(_local_1a0,auVar62);
  auVar63._4_4_ = auVar134._4_4_ * (auVar219._4_4_ + fVar156 * auVar168._4_4_);
  auVar63._0_4_ = auVar134._0_4_ * (auVar219._0_4_ + fVar151 * auVar168._0_4_);
  auVar63._8_4_ = auVar134._8_4_ * (auVar219._8_4_ + fVar157 * auVar168._8_4_);
  auVar63._12_4_ = auVar134._12_4_ * (auVar219._12_4_ + fVar158 * auVar168._12_4_);
  auVar63._16_4_ = auVar134._16_4_ * (auVar219._16_4_ + fVar159 * auVar168._16_4_);
  auVar63._20_4_ = auVar134._20_4_ * (auVar219._20_4_ + fVar160 * auVar168._20_4_);
  auVar63._24_4_ = auVar134._24_4_ * (auVar219._24_4_ + fVar161 * auVar168._24_4_);
  auVar63._28_4_ = auVar219._28_4_ + fVar152;
  auVar64._4_4_ = auVar165._4_4_ * auVar165._4_4_;
  auVar64._0_4_ = auVar165._0_4_ * auVar165._0_4_;
  auVar64._8_4_ = auVar165._8_4_ * auVar165._8_4_;
  auVar64._12_4_ = auVar165._12_4_ * auVar165._12_4_;
  auVar64._16_4_ = auVar165._16_4_ * auVar165._16_4_;
  auVar64._20_4_ = auVar165._20_4_ * auVar165._20_4_;
  auVar64._24_4_ = auVar165._24_4_ * auVar165._24_4_;
  auVar64._28_4_ = fVar152;
  auVar219 = vsubps_avx(auVar64,auVar63);
  auVar168 = vcmpps_avx(auVar219,ZEXT432(0) << 0x20,5);
  auVar143 = auVar168 & ~auVar112;
  if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar143 >> 0x7f,0) != '\0') ||
        (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar143 >> 0xbf,0) != '\0') ||
      (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar143[0x1f] < '\0')
  {
    auVar143 = vandnps_avx(auVar112,auVar168);
    auVar57 = vsubps_avx(auVar199,auVar111);
    auVar58 = vsubps_avx(auVar153,auVar102);
    auVar111 = vsubps_avx(auVar103,auVar116);
    fVar190 = auVar57._0_4_ * fVar162 + auVar111._0_4_ * fVar98 + auVar58._0_4_ * fVar188;
    fVar193 = auVar57._4_4_ * fVar14 + auVar111._4_4_ * fVar179 + auVar58._4_4_ * fVar181;
    fVar194 = auVar57._8_4_ * fVar22 + auVar111._8_4_ * fVar20 + auVar58._8_4_ * fVar21;
    fVar195 = auVar57._12_4_ * fVar30 + auVar111._12_4_ * fVar28 + auVar58._12_4_ * fVar29;
    fVar196 = auVar57._16_4_ * fVar37 + auVar111._16_4_ * fVar35 + auVar58._16_4_ * fVar36;
    fVar197 = auVar57._20_4_ * fVar44 + auVar111._20_4_ * fVar42 + auVar58._20_4_ * fVar43;
    fVar198 = auVar57._24_4_ * fVar51 + auVar111._24_4_ * fVar49 + auVar58._24_4_ * fVar50;
    auVar219 = vsqrtps_avx(auVar219);
    auVar168 = vrcpps_avx(auVar134);
    fVar152 = auVar168._0_4_;
    auVar218._0_4_ = auVar134._0_4_ * fVar152;
    fVar151 = auVar168._4_4_;
    auVar218._4_4_ = auVar134._4_4_ * fVar151;
    fVar156 = auVar168._8_4_;
    auVar218._8_4_ = auVar134._8_4_ * fVar156;
    fVar157 = auVar168._12_4_;
    auVar218._12_4_ = auVar134._12_4_ * fVar157;
    fVar158 = auVar168._16_4_;
    auVar218._16_4_ = auVar134._16_4_ * fVar158;
    fVar159 = auVar168._20_4_;
    auVar218._20_4_ = auVar134._20_4_ * fVar159;
    fVar160 = auVar168._24_4_;
    auVar218._24_4_ = auVar134._24_4_ * fVar160;
    auVar218._28_4_ = 0;
    auVar215._8_4_ = 0x3f800000;
    auVar215._0_8_ = 0x3f8000003f800000;
    auVar215._12_4_ = 0x3f800000;
    auVar215._16_4_ = 0x3f800000;
    auVar215._20_4_ = 0x3f800000;
    auVar215._24_4_ = 0x3f800000;
    auVar215._28_4_ = 0x3f800000;
    auVar205 = vsubps_avx(auVar215,auVar218);
    auVar118._8_4_ = 0x7fffffff;
    auVar118._0_8_ = 0x7fffffff7fffffff;
    auVar118._12_4_ = 0x7fffffff;
    auVar118._16_4_ = 0x7fffffff;
    auVar118._20_4_ = 0x7fffffff;
    auVar118._24_4_ = 0x7fffffff;
    auVar118._28_4_ = 0x7fffffff;
    fVar152 = auVar205._0_4_ * fVar152 + fVar152;
    fVar151 = auVar205._4_4_ * fVar151 + fVar151;
    fVar156 = auVar205._8_4_ * fVar156 + fVar156;
    fVar157 = auVar205._12_4_ * fVar157 + fVar157;
    fVar158 = auVar205._16_4_ * fVar158 + fVar158;
    fVar159 = auVar205._20_4_ * fVar159 + fVar159;
    fVar160 = auVar205._24_4_ * fVar160 + fVar160;
    fVar161 = auVar205._28_4_ + auVar168._28_4_;
    auVar168 = vandps_avx(auVar134,auVar118);
    auVar184._8_4_ = 0x219392ef;
    auVar184._0_8_ = 0x219392ef219392ef;
    auVar184._12_4_ = 0x219392ef;
    auVar184._16_4_ = 0x219392ef;
    auVar184._20_4_ = 0x219392ef;
    auVar184._24_4_ = 0x219392ef;
    auVar184._28_4_ = 0x219392ef;
    auVar168 = vcmpps_avx(auVar168,auVar184,2);
    uVar97 = CONCAT44(auVar165._4_4_,auVar165._0_4_);
    auVar185._0_8_ = uVar97 ^ 0x8000000080000000;
    auVar185._8_4_ = -auVar165._8_4_;
    auVar185._12_4_ = -auVar165._12_4_;
    auVar185._16_4_ = -auVar165._16_4_;
    auVar185._20_4_ = -auVar165._20_4_;
    auVar185._24_4_ = -auVar165._24_4_;
    auVar185._28_4_ = -auVar165._28_4_;
    auVar134 = vsubps_avx(auVar185,auVar219);
    auVar219 = vsubps_avx(auVar219,auVar165);
    auVar65._4_4_ = auVar134._4_4_ * fVar151;
    auVar65._0_4_ = auVar134._0_4_ * fVar152;
    auVar65._8_4_ = auVar134._8_4_ * fVar156;
    auVar65._12_4_ = auVar134._12_4_ * fVar157;
    auVar65._16_4_ = auVar134._16_4_ * fVar158;
    auVar65._20_4_ = auVar134._20_4_ * fVar159;
    auVar65._24_4_ = auVar134._24_4_ * fVar160;
    auVar65._28_4_ = auVar165._28_4_;
    auVar66._4_4_ = auVar219._4_4_ * fVar151;
    auVar66._0_4_ = auVar219._0_4_ * fVar152;
    auVar66._8_4_ = auVar219._8_4_ * fVar156;
    auVar66._12_4_ = auVar219._12_4_ * fVar157;
    auVar66._16_4_ = auVar219._16_4_ * fVar158;
    auVar66._20_4_ = auVar219._20_4_ * fVar159;
    auVar66._24_4_ = auVar219._24_4_ * fVar160;
    auVar66._28_4_ = fVar161;
    auVar137._8_4_ = 0xff800000;
    auVar137._0_8_ = 0xff800000ff800000;
    auVar137._12_4_ = 0xff800000;
    auVar137._16_4_ = 0xff800000;
    auVar137._20_4_ = 0xff800000;
    auVar137._24_4_ = 0xff800000;
    auVar137._28_4_ = 0xff800000;
    auVar219 = vblendvps_avx(auVar65,auVar137,auVar168);
    auVar223._8_4_ = 0x7f800000;
    auVar223._0_8_ = 0x7f8000007f800000;
    auVar223._12_4_ = 0x7f800000;
    auVar223._16_4_ = 0x7f800000;
    auVar223._20_4_ = 0x7f800000;
    auVar223._24_4_ = 0x7f800000;
    auVar223._28_4_ = 0x7f800000;
    auVar134 = vblendvps_avx(auVar66,auVar223,auVar168);
    auVar186._0_4_ = fVar203 + auVar201._0_4_ * auVar219._0_4_;
    auVar186._4_4_ = fVar207 + auVar201._4_4_ * auVar219._4_4_;
    auVar186._8_4_ = fVar208 + auVar201._8_4_ * auVar219._8_4_;
    auVar186._12_4_ = fVar209 + auVar201._12_4_ * auVar219._12_4_;
    auVar186._16_4_ = fVar210 + auVar201._16_4_ * auVar219._16_4_;
    auVar186._20_4_ = fVar211 + auVar201._20_4_ * auVar219._20_4_;
    auVar186._24_4_ = fVar212 + auVar201._24_4_ * auVar219._24_4_;
    auVar186._28_4_ = fVar213 + fVar161;
    auVar168 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,6);
    auVar205 = vcmpps_avx(auVar186,_local_460,1);
    auVar168 = vandps_avx(auVar205,auVar168);
    auVar168 = vandps_avx(auVar143,auVar168);
    local_4a0 = vblendvps_avx(auVar223,auVar219,auVar168);
    fStack_84 = local_4a0._28_4_;
    local_440._0_4_ = fVar203 + auVar201._0_4_ * auVar134._0_4_;
    local_440._4_4_ = fVar207 + auVar201._4_4_ * auVar134._4_4_;
    fStack_438 = fVar208 + auVar201._8_4_ * auVar134._8_4_;
    fStack_434 = fVar209 + auVar201._12_4_ * auVar134._12_4_;
    fStack_430 = fVar210 + auVar201._16_4_ * auVar134._16_4_;
    fStack_42c = fVar211 + auVar201._20_4_ * auVar134._20_4_;
    fStack_428 = fVar212 + auVar201._24_4_ * auVar134._24_4_;
    register0x000012dc = fVar213 + fStack_84;
    auVar168 = vcmpps_avx(_local_440,ZEXT832(0) << 0x20,6);
    auVar219 = vcmpps_avx(_local_440,_local_460,1);
    auVar168 = vandps_avx(auVar219,auVar168);
    auVar168 = vandps_avx(auVar143,auVar168);
    auVar134 = vblendvps_avx(auVar137,auVar134,auVar168);
    auVar102 = vrcpps_avx(auVar201);
    fVar152 = auVar102._0_4_;
    fVar151 = auVar102._4_4_;
    auVar67._4_4_ = auVar201._4_4_ * fVar151;
    auVar67._0_4_ = auVar201._0_4_ * fVar152;
    fVar156 = auVar102._8_4_;
    auVar67._8_4_ = auVar201._8_4_ * fVar156;
    fVar157 = auVar102._12_4_;
    auVar67._12_4_ = auVar201._12_4_ * fVar157;
    fVar158 = auVar102._16_4_;
    auVar67._16_4_ = auVar201._16_4_ * fVar158;
    fVar159 = auVar102._20_4_;
    auVar67._20_4_ = auVar201._20_4_ * fVar159;
    fVar160 = auVar102._24_4_;
    auVar67._24_4_ = auVar201._24_4_ * fVar160;
    auVar67._28_4_ = auVar168._28_4_;
    auVar168 = vsubps_avx(auVar215,auVar67);
    fVar152 = fVar152 + fVar152 * auVar168._0_4_;
    fVar151 = fVar151 + fVar151 * auVar168._4_4_;
    fVar156 = fVar156 + fVar156 * auVar168._8_4_;
    fVar157 = fVar157 + fVar157 * auVar168._12_4_;
    fVar158 = fVar158 + fVar158 * auVar168._16_4_;
    fVar159 = fVar159 + fVar159 * auVar168._20_4_;
    fVar160 = fVar160 + fVar160 * auVar168._24_4_;
    auVar68._4_4_ = auVar201._4_4_ * fVar17;
    auVar68._0_4_ = auVar201._0_4_ * fVar175;
    auVar68._8_4_ = auVar201._8_4_ * fVar25;
    auVar68._12_4_ = auVar201._12_4_ * fVar33;
    auVar68._16_4_ = auVar201._16_4_ * fVar40;
    auVar68._20_4_ = auVar201._20_4_ * fVar47;
    auVar68._24_4_ = auVar201._24_4_ * fVar54;
    auVar68._28_4_ = auVar168._28_4_;
    auVar69._4_4_ = fVar207 * local_2c0;
    auVar69._0_4_ = fVar203 * local_2c0;
    auVar69._8_4_ = fVar208 * local_2c0;
    auVar69._12_4_ = fVar209 * local_2c0;
    auVar69._16_4_ = fVar210 * local_2c0;
    auVar69._20_4_ = fVar211 * local_2c0;
    auVar69._24_4_ = fVar212 * local_2c0;
    auVar69._28_4_ = auVar219._28_4_;
    auVar168 = vsubps_avx(auVar68,auVar69);
    auVar70._4_4_ = auVar201._4_4_ * fVar16;
    auVar70._0_4_ = auVar201._0_4_ * fVar173;
    auVar70._8_4_ = auVar201._8_4_ * fVar24;
    auVar70._12_4_ = auVar201._12_4_ * fVar32;
    auVar70._16_4_ = auVar201._16_4_ * fVar39;
    auVar70._20_4_ = auVar201._20_4_ * fVar46;
    auVar70._24_4_ = auVar201._24_4_ * fVar53;
    auVar70._28_4_ = auVar219._28_4_;
    auVar71._4_4_ = fVar207 * fVar13;
    auVar71._0_4_ = fVar203 * fVar189;
    auVar71._8_4_ = fVar208 * fVar19;
    auVar71._12_4_ = fVar209 * fVar27;
    auVar71._16_4_ = fVar210 * fVar189;
    auVar71._20_4_ = fVar211 * fVar13;
    auVar71._24_4_ = fVar212 * fVar19;
    auVar71._28_4_ = auVar205._28_4_;
    auVar219 = vsubps_avx(auVar70,auVar71);
    auVar72._4_4_ = auVar201._4_4_ * fVar15;
    auVar72._0_4_ = auVar201._0_4_ * fVar171;
    auVar72._8_4_ = auVar201._8_4_ * fVar23;
    auVar72._12_4_ = auVar201._12_4_ * fVar31;
    auVar72._16_4_ = auVar201._16_4_ * fVar38;
    auVar72._20_4_ = auVar201._20_4_ * fVar45;
    auVar72._24_4_ = auVar201._24_4_ * fVar52;
    auVar72._28_4_ = auVar205._28_4_;
    auVar73._4_4_ = fVar221 * fVar207;
    auVar73._0_4_ = fVar217 * fVar203;
    auVar73._8_4_ = fVar222 * fVar208;
    auVar73._12_4_ = fStack_344 * fVar209;
    auVar73._16_4_ = fVar217 * fVar210;
    auVar73._20_4_ = fVar221 * fVar211;
    auVar73._24_4_ = fVar222 * fVar212;
    auVar73._28_4_ = 0xff800000;
    auVar205 = vsubps_avx(auVar72,auVar73);
    fVar161 = auVar219._28_4_;
    auVar138._0_4_ =
         auVar168._0_4_ * auVar168._0_4_ +
         auVar219._0_4_ * auVar219._0_4_ + auVar205._0_4_ * auVar205._0_4_;
    auVar138._4_4_ =
         auVar168._4_4_ * auVar168._4_4_ +
         auVar219._4_4_ * auVar219._4_4_ + auVar205._4_4_ * auVar205._4_4_;
    auVar138._8_4_ =
         auVar168._8_4_ * auVar168._8_4_ +
         auVar219._8_4_ * auVar219._8_4_ + auVar205._8_4_ * auVar205._8_4_;
    auVar138._12_4_ =
         auVar168._12_4_ * auVar168._12_4_ +
         auVar219._12_4_ * auVar219._12_4_ + auVar205._12_4_ * auVar205._12_4_;
    auVar138._16_4_ =
         auVar168._16_4_ * auVar168._16_4_ +
         auVar219._16_4_ * auVar219._16_4_ + auVar205._16_4_ * auVar205._16_4_;
    auVar138._20_4_ =
         auVar168._20_4_ * auVar168._20_4_ +
         auVar219._20_4_ * auVar219._20_4_ + auVar205._20_4_ * auVar205._20_4_;
    auVar138._24_4_ =
         auVar168._24_4_ * auVar168._24_4_ +
         auVar219._24_4_ * auVar219._24_4_ + auVar205._24_4_ * auVar205._24_4_;
    auVar138._28_4_ = auVar168._28_4_ + fVar161 + auVar205._28_4_;
    auVar74._4_4_ = fVar172 * fVar172 * fVar115;
    auVar74._0_4_ = fVar163 * fVar163 * fVar120;
    auVar74._8_4_ = fVar174 * fVar174 * fVar123;
    auVar74._12_4_ = fVar176 * fVar176 * fVar124;
    auVar74._16_4_ = fVar178 * fVar178 * fVar125;
    auVar74._20_4_ = fVar180 * fVar180 * fVar126;
    auVar74._24_4_ = fVar182 * fVar182 * fVar127;
    auVar74._28_4_ = auVar101._28_4_;
    auVar168 = vcmpps_avx(auVar138,auVar74,1);
    auVar75._4_4_ = fVar151 * -fVar207;
    auVar75._0_4_ = fVar152 * -fVar203;
    auVar75._8_4_ = fVar156 * -fVar208;
    auVar75._12_4_ = fVar157 * -fVar209;
    auVar75._16_4_ = fVar158 * -fVar210;
    auVar75._20_4_ = fVar159 * -fVar211;
    auVar75._24_4_ = fVar160 * -fVar212;
    auVar75._28_4_ = -fVar213;
    auVar219 = vblendvps_avx(auVar223,auVar75,auVar168);
    auVar154._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar154._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar168 = vandnps_avx(auVar154,auVar143);
    local_560 = vblendvps_avx(auVar223,auVar219,auVar168);
    auVar139._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar139._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar132._0_4_ = auVar201._0_4_ * auVar57._0_4_;
    auVar132._4_4_ = auVar201._4_4_ * auVar57._4_4_;
    auVar132._8_4_ = auVar201._8_4_ * auVar57._8_4_;
    auVar132._12_4_ = auVar201._12_4_ * auVar57._12_4_;
    auVar132._16_4_ = auVar201._16_4_ * auVar57._16_4_;
    auVar132._20_4_ = auVar201._20_4_ * auVar57._20_4_;
    auVar132._24_4_ = auVar201._24_4_ * auVar57._24_4_;
    auVar132._28_4_ = 0;
    auVar76._4_4_ = auVar201._4_4_ * auVar58._4_4_;
    auVar76._0_4_ = auVar201._0_4_ * auVar58._0_4_;
    auVar76._8_4_ = auVar201._8_4_ * auVar58._8_4_;
    auVar76._12_4_ = auVar201._12_4_ * auVar58._12_4_;
    auVar76._16_4_ = auVar201._16_4_ * auVar58._16_4_;
    auVar76._20_4_ = auVar201._20_4_ * auVar58._20_4_;
    auVar76._24_4_ = auVar201._24_4_ * auVar58._24_4_;
    auVar76._28_4_ = auVar168._28_4_;
    auVar77._4_4_ = auVar201._4_4_ * auVar111._4_4_;
    auVar77._0_4_ = auVar201._0_4_ * auVar111._0_4_;
    auVar77._8_4_ = auVar201._8_4_ * auVar111._8_4_;
    auVar77._12_4_ = auVar201._12_4_ * auVar111._12_4_;
    auVar77._16_4_ = auVar201._16_4_ * auVar111._16_4_;
    auVar77._20_4_ = auVar201._20_4_ * auVar111._20_4_;
    auVar77._24_4_ = auVar201._24_4_ * auVar111._24_4_;
    auVar77._28_4_ = 0;
    auVar78._4_4_ = fVar193 * local_2c0;
    auVar78._0_4_ = fVar190 * local_2c0;
    auVar78._8_4_ = fVar194 * local_2c0;
    auVar78._12_4_ = fVar195 * local_2c0;
    auVar78._16_4_ = fVar196 * local_2c0;
    auVar78._20_4_ = fVar197 * local_2c0;
    auVar78._24_4_ = fVar198 * local_2c0;
    auVar78._28_4_ = fVar161;
    auVar168 = vsubps_avx(auVar132,auVar78);
    auVar79._4_4_ = fVar193 * fVar13;
    auVar79._0_4_ = fVar190 * fVar189;
    auVar79._8_4_ = fVar194 * fVar19;
    auVar79._12_4_ = fVar195 * fVar27;
    auVar79._16_4_ = fVar196 * fVar189;
    auVar79._20_4_ = fVar197 * fVar13;
    auVar79._24_4_ = fVar198 * fVar19;
    auVar79._28_4_ = fVar161;
    auVar219 = vsubps_avx(auVar76,auVar79);
    auVar80._4_4_ = fVar221 * fVar193;
    auVar80._0_4_ = fVar217 * fVar190;
    auVar80._8_4_ = fVar222 * fVar194;
    auVar80._12_4_ = fStack_344 * fVar195;
    auVar80._16_4_ = fVar217 * fVar196;
    auVar80._20_4_ = fVar221 * fVar197;
    auVar80._24_4_ = fVar222 * fVar198;
    auVar80._28_4_ = fVar161;
    auVar205 = vsubps_avx(auVar77,auVar80);
    auVar113._0_4_ =
         auVar168._0_4_ * auVar168._0_4_ +
         auVar219._0_4_ * auVar219._0_4_ + auVar205._0_4_ * auVar205._0_4_;
    auVar113._4_4_ =
         auVar168._4_4_ * auVar168._4_4_ +
         auVar219._4_4_ * auVar219._4_4_ + auVar205._4_4_ * auVar205._4_4_;
    auVar113._8_4_ =
         auVar168._8_4_ * auVar168._8_4_ +
         auVar219._8_4_ * auVar219._8_4_ + auVar205._8_4_ * auVar205._8_4_;
    auVar113._12_4_ =
         auVar168._12_4_ * auVar168._12_4_ +
         auVar219._12_4_ * auVar219._12_4_ + auVar205._12_4_ * auVar205._12_4_;
    auVar113._16_4_ =
         auVar168._16_4_ * auVar168._16_4_ +
         auVar219._16_4_ * auVar219._16_4_ + auVar205._16_4_ * auVar205._16_4_;
    auVar113._20_4_ =
         auVar168._20_4_ * auVar168._20_4_ +
         auVar219._20_4_ * auVar219._20_4_ + auVar205._20_4_ * auVar205._20_4_;
    auVar113._24_4_ =
         auVar168._24_4_ * auVar168._24_4_ +
         auVar219._24_4_ * auVar219._24_4_ + auVar205._24_4_ * auVar205._24_4_;
    auVar113._28_4_ = auVar168._28_4_ + auVar219._28_4_ + auVar205._28_4_;
    auVar129 = SUB3216(*(undefined1 (*) [32])((long)&(ray->org).field_0 + 0xc),0);
    auVar129 = vshufps_avx(auVar129,auVar129,0);
    auVar133._16_16_ = auVar129;
    auVar133._0_16_ = auVar129;
    auVar168 = vandnps_avx(auVar139,auVar143);
    local_480._0_4_ = auVar110._0_4_;
    local_480._4_4_ = auVar110._4_4_;
    fStack_478 = auVar110._8_4_;
    fStack_474 = auVar110._12_4_;
    fStack_470 = auVar110._16_4_;
    fStack_46c = auVar110._20_4_;
    fStack_468 = auVar110._24_4_;
    uStack_464 = auVar110._28_4_;
    auVar81._4_4_ = (float)local_480._4_4_ * (float)local_480._4_4_ * fVar115;
    auVar81._0_4_ = (float)local_480._0_4_ * (float)local_480._0_4_ * fVar120;
    auVar81._8_4_ = fStack_478 * fStack_478 * fVar123;
    auVar81._12_4_ = fStack_474 * fStack_474 * fVar124;
    auVar81._16_4_ = fStack_470 * fStack_470 * fVar125;
    auVar81._20_4_ = fStack_46c * fStack_46c * fVar126;
    auVar81._24_4_ = fStack_468 * fStack_468 * fVar127;
    auVar81._28_4_ = uStack_464;
    auVar219 = vcmpps_avx(auVar113,auVar81,1);
    auVar82._4_4_ = fVar151 * -fVar193;
    auVar82._0_4_ = fVar152 * -fVar190;
    auVar82._8_4_ = fVar156 * -fVar194;
    auVar82._12_4_ = fVar157 * -fVar195;
    auVar82._16_4_ = fVar158 * -fVar196;
    auVar82._20_4_ = fVar159 * -fVar197;
    auVar82._24_4_ = fVar160 * -fVar198;
    auVar82._28_4_ = fVar27;
    auVar219 = vblendvps_avx(auVar223,auVar82,auVar219);
    auVar168 = vblendvps_avx(auVar223,auVar219,auVar168);
    auVar101 = vminps_avx(local_560,auVar168);
    auVar219 = vmaxps_avx(local_560,auVar168);
    auVar102 = vminps_avx(local_4a0,auVar101);
    auVar205 = vcmpps_avx(auVar102,auVar101,0);
    auVar168 = vcmpps_avx(auVar223,auVar219,0);
    auVar202._8_4_ = 0xff800000;
    auVar202._0_8_ = 0xff800000ff800000;
    auVar202._12_4_ = 0xff800000;
    auVar202._16_4_ = 0xff800000;
    auVar202._20_4_ = 0xff800000;
    auVar202._24_4_ = 0xff800000;
    auVar202._28_4_ = 0xff800000;
    auVar168 = vblendvps_avx(auVar219,auVar202,auVar168);
    auVar219 = vcmpps_avx(auVar223,auVar101,0);
    auVar219 = vblendvps_avx(auVar101,auVar202,auVar219);
    auVar219 = vblendvps_avx(auVar219,auVar168,auVar205);
    auVar140._0_4_ = local_160 + auVar102._0_4_;
    auVar140._4_4_ = fStack_15c + auVar102._4_4_;
    auVar140._8_4_ = fStack_158 + auVar102._8_4_;
    auVar140._12_4_ = fStack_154 + auVar102._12_4_;
    auVar140._16_4_ = fStack_150 + auVar102._16_4_;
    auVar140._20_4_ = fStack_14c + auVar102._20_4_;
    auVar140._24_4_ = fStack_148 + auVar102._24_4_;
    auVar140._28_4_ = fStack_144 + auVar102._28_4_;
    auVar168 = vcmpps_avx(auVar133,auVar140,2);
    local_1b0._0_4_ = ray->tfar;
    local_1b0._4_4_ = ray->mask;
    local_1b0._8_4_ = ray->id;
    local_1b0._12_4_ = ray->flags;
    auVar129 = vshufps_avx(local_1b0,local_1b0,0);
    auVar166._16_16_ = auVar129;
    auVar166._0_16_ = auVar129;
    auVar205 = vcmpps_avx(auVar140,auVar166,2);
    auVar168 = vandps_avx(auVar205,auVar168);
    _local_480 = auVar134;
    local_4e0 = vmaxps_avx(auVar134,auVar219);
    auVar219 = vcmpps_avx(auVar223,auVar102,4);
    auVar219 = vandps_avx(auVar143,auVar219);
    local_500 = vandps_avx(auVar168,auVar219);
    local_4c0._0_4_ = local_160 + local_4e0._0_4_;
    local_4c0._4_4_ = fStack_15c + local_4e0._4_4_;
    local_4c0._8_4_ = fStack_158 + local_4e0._8_4_;
    local_4c0._12_4_ = fStack_154 + local_4e0._12_4_;
    local_4c0._16_4_ = fStack_150 + local_4e0._16_4_;
    local_4c0._20_4_ = fStack_14c + local_4e0._20_4_;
    local_4c0._24_4_ = fStack_148 + local_4e0._24_4_;
    local_4c0._28_4_ = fStack_144 + local_4e0._28_4_;
    auVar168 = vcmpps_avx(auVar133,local_4c0,2);
    auVar219 = vcmpps_avx(local_4c0,auVar166,2);
    auVar168 = vandps_avx(auVar219,auVar168);
    auVar219 = vcmpps_avx(auVar202,local_4e0,4);
    auVar219 = vandps_avx(auVar143,auVar219);
    local_520 = vandps_avx(auVar168,auVar219);
    local_540 = vorps_avx(local_500,local_520);
    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_540 >> 0x7f,0) != '\0') ||
          (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_540 >> 0xbf,0) != '\0') ||
        (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_540[0x1f] < '\0') {
      auVar205 = vblendvps_avx(local_4e0,auVar102,local_500);
      auVar101 = vblendvps_avx(_local_440,auVar186,local_500);
      fVar163 = (float)local_460._0_4_ * fVar177 * fVar163;
      fVar172 = (float)local_460._4_4_ * fVar18 * fVar172;
      fVar174 = fStack_458 * fVar26 * fVar174;
      fVar176 = fStack_454 * fVar34 * fVar176;
      fVar178 = fStack_450 * fVar41 * fVar178;
      fVar180 = fStack_44c * fVar48 * fVar180;
      fVar182 = fStack_448 * fVar55 * fVar182;
      auVar220 = ZEXT3264(local_420);
      auVar168 = vcmpps_avx(local_4a0,auVar205,0);
      auVar219 = vcmpps_avx(auVar205,auVar134,0);
      auVar168 = vorps_avx(auVar168,auVar219);
      auVar168 = vandps_avx(auVar143,auVar168);
      auVar134 = vcmpps_avx(local_560,auVar205,0);
      auVar219 = vandps_avx(auVar143,auVar134);
      fVar152 = auVar205._0_4_;
      fVar177 = auVar205._4_4_;
      fVar18 = auVar205._8_4_;
      fVar26 = auVar205._12_4_;
      fVar34 = auVar205._16_4_;
      fVar41 = auVar205._20_4_;
      fVar48 = auVar205._24_4_;
      fStack_31c = fVar14 * fVar172;
      local_320 = fVar162 * fVar163;
      fStack_318 = fVar22 * fVar174;
      fStack_314 = fVar30 * fVar176;
      fStack_310 = fVar37 * fVar178;
      fStack_30c = fVar44 * fVar180;
      fStack_308 = fVar51 * fVar182;
      fStack_304 = local_500._28_4_;
      auVar141._0_4_ = fVar162 * fVar163 + fVar136 * (local_2c0 * fVar152 + fVar175);
      auVar141._4_4_ = fVar14 * fVar172 + fVar145 * (local_2c0 * fVar177 + fVar17);
      auVar141._8_4_ = fVar22 * fVar174 + fVar146 * (local_2c0 * fVar18 + fVar25);
      auVar141._12_4_ = fVar30 * fVar176 + fVar147 * (local_2c0 * fVar26 + fVar33);
      auVar141._16_4_ = fVar37 * fVar178 + fVar148 * (local_2c0 * fVar34 + fVar40);
      auVar141._20_4_ = fVar44 * fVar180 + fVar149 * (local_2c0 * fVar41 + fVar47);
      auVar141._24_4_ = fVar51 * fVar182 + fVar150 * (local_2c0 * fVar48 + fVar54);
      auVar141._28_4_ = local_500._28_4_ + auVar134._28_4_ + (float)local_580._28_4_;
      fStack_35c = fVar14 * fVar104;
      local_360 = fVar162 * fVar99;
      fStack_358 = fVar22 * fVar105;
      fStack_354 = fVar30 * fVar106;
      fStack_350 = fVar37 * fVar107;
      fStack_34c = fVar44 * fVar108;
      fStack_348 = fVar51 * fVar109;
      fVar175 = auVar101._0_4_;
      fVar17 = auVar101._4_4_;
      auVar83._4_4_ = fVar14 * fVar104 * fVar17;
      auVar83._0_4_ = fVar162 * fVar99 * fVar175;
      fVar162 = auVar101._8_4_;
      auVar83._8_4_ = fVar22 * fVar105 * fVar162;
      fVar14 = auVar101._12_4_;
      auVar83._12_4_ = fVar30 * fVar106 * fVar14;
      fVar25 = auVar101._16_4_;
      auVar83._16_4_ = fVar37 * fVar107 * fVar25;
      fVar33 = auVar101._20_4_;
      auVar83._20_4_ = fVar44 * fVar108 * fVar33;
      fVar40 = auVar101._24_4_;
      auVar83._24_4_ = fVar51 * fVar109 * fVar40;
      auVar83._28_4_ = fStack_344;
      auVar143 = vsubps_avx(auVar141,auVar83);
      local_c0._0_8_ = local_420._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar22;
      local_c0._12_4_ = -fVar30;
      local_c0._16_4_ = -fVar37;
      local_c0._20_4_ = -fVar44;
      local_c0._24_4_ = -fVar51;
      local_c0._28_4_ = local_420._28_4_ ^ 0x80000000;
      auVar134 = vblendvps_avx(local_420,local_c0,auVar219);
      local_2e0 = vblendvps_avx(auVar134,auVar143,auVar168);
      auVar135 = ZEXT3264(local_3a0);
      local_a0 = fVar188 * fVar163;
      fStack_9c = fVar181 * fVar172;
      fStack_98 = fVar21 * fVar174;
      fStack_94 = fVar29 * fVar176;
      fStack_90 = fVar36 * fVar178;
      fStack_8c = fVar43 * fVar180;
      fStack_88 = fVar50 * fVar182;
      auVar142._0_4_ = fVar188 * fVar163 + fVar136 * (fVar173 + fVar189 * fVar152);
      auVar142._4_4_ = fVar181 * fVar172 + fVar145 * (fVar16 + fVar13 * fVar177);
      auVar142._8_4_ = fVar21 * fVar174 + fVar146 * (fVar24 + fVar19 * fVar18);
      auVar142._12_4_ = fVar29 * fVar176 + fVar147 * (fVar32 + fVar27 * fVar26);
      auVar142._16_4_ = fVar36 * fVar178 + fVar148 * (fVar39 + fVar189 * fVar34);
      auVar142._20_4_ = fVar43 * fVar180 + fVar149 * (fVar46 + fVar13 * fVar41);
      auVar142._24_4_ = fVar50 * fVar182 + fVar150 * (fVar53 + fVar19 * fVar48);
      auVar142._28_4_ = fStack_84 + local_3e0._28_4_ + auVar143._28_4_;
      local_80 = fVar188 * fVar99;
      fStack_7c = fVar181 * fVar104;
      fStack_78 = fVar21 * fVar105;
      fStack_74 = fVar29 * fVar106;
      fStack_70 = fVar36 * fVar107;
      fStack_6c = fVar43 * fVar108;
      fStack_68 = fVar50 * fVar109;
      fStack_64 = fStack_84;
      auVar84._4_4_ = fVar181 * fVar104 * fVar17;
      auVar84._0_4_ = fVar188 * fVar99 * fVar175;
      auVar84._8_4_ = fVar21 * fVar105 * fVar162;
      auVar84._12_4_ = fVar29 * fVar106 * fVar14;
      auVar84._16_4_ = fVar36 * fVar107 * fVar25;
      auVar84._20_4_ = fVar43 * fVar108 * fVar33;
      auVar84._24_4_ = fVar50 * fVar109 * fVar40;
      auVar84._28_4_ = fStack_84;
      auVar143 = vsubps_avx(auVar142,auVar84);
      local_120._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar21;
      local_120._12_4_ = -fVar29;
      local_120._16_4_ = -fVar36;
      local_120._20_4_ = -fVar43;
      local_120._24_4_ = -fVar50;
      local_120._28_4_ = local_3a0._28_4_ ^ 0x80000000;
      auVar134 = vblendvps_avx(local_3a0,local_120,auVar219);
      local_300 = vblendvps_avx(auVar134,auVar143,auVar168);
      auVar144 = ZEXT3264(local_3c0);
      auVar216 = ZEXT3264(local_380);
      local_e0 = fVar98 * fVar163;
      fStack_dc = fVar179 * fVar172;
      fStack_d8 = fVar20 * fVar174;
      fStack_d4 = fVar28 * fVar176;
      fStack_d0 = fVar35 * fVar178;
      fStack_cc = fVar42 * fVar180;
      fStack_c8 = fVar49 * fVar182;
      fStack_c4 = auVar134._28_4_;
      auVar167._0_4_ = fVar98 * fVar163 + fVar136 * (fVar171 + fVar217 * fVar152);
      auVar167._4_4_ = fVar179 * fVar172 + fVar145 * (fVar15 + fVar221 * fVar177);
      auVar167._8_4_ = fVar20 * fVar174 + fVar146 * (fVar23 + fVar222 * fVar18);
      auVar167._12_4_ = fVar28 * fVar176 + fVar147 * (fVar31 + fStack_344 * fVar26);
      auVar167._16_4_ = fVar35 * fVar178 + fVar148 * (fVar38 + fVar217 * fVar34);
      auVar167._20_4_ = fVar42 * fVar180 + fVar149 * (fVar45 + fVar221 * fVar41);
      auVar167._24_4_ = fVar49 * fVar182 + fVar150 * (fVar52 + fVar222 * fVar48);
      auVar167._28_4_ = auVar134._28_4_ + fVar119 + auVar129._12_4_;
      auVar143 = vrcpps_avx(_local_460);
      local_340 = fVar98 * fVar99;
      fStack_33c = fVar179 * fVar104;
      fStack_338 = fVar20 * fVar105;
      fStack_334 = fVar28 * fVar106;
      fStack_330 = fVar35 * fVar107;
      fStack_32c = fVar42 * fVar108;
      fStack_328 = fVar49 * fVar109;
      uStack_324 = local_560._28_4_;
      auVar85._4_4_ = fVar179 * fVar104 * fVar17;
      auVar85._0_4_ = fVar98 * fVar99 * fVar175;
      auVar85._8_4_ = fVar20 * fVar105 * fVar162;
      auVar85._12_4_ = fVar28 * fVar106 * fVar14;
      auVar85._16_4_ = fVar35 * fVar107 * fVar25;
      auVar85._20_4_ = fVar42 * fVar108 * fVar33;
      auVar85._24_4_ = fVar49 * fVar109 * fVar40;
      auVar85._28_4_ = fVar27;
      auVar101 = vsubps_avx(auVar167,auVar85);
      local_140._0_8_ = local_3c0._0_8_ ^ 0x8000000080000000;
      local_140._8_4_ = -fVar20;
      local_140._12_4_ = -fVar28;
      local_140._16_4_ = -fVar35;
      local_140._20_4_ = -fVar42;
      local_140._24_4_ = -fVar49;
      local_140._28_4_ = local_3c0._28_4_ ^ 0x80000000;
      auVar134 = vblendvps_avx(local_3c0,local_140,auVar219);
      local_1e0 = vblendvps_avx(auVar134,auVar101,auVar168);
      auVar170 = ZEXT3264(local_1e0);
      local_100 = auVar143._0_4_;
      fStack_fc = auVar143._4_4_;
      auVar86._4_4_ = fStack_fc * (float)local_460._4_4_;
      auVar86._0_4_ = local_100 * (float)local_460._0_4_;
      fStack_f8 = auVar143._8_4_;
      auVar86._8_4_ = fStack_f8 * fStack_458;
      fStack_f4 = auVar143._12_4_;
      auVar86._12_4_ = fStack_f4 * fStack_454;
      fStack_f0 = auVar143._16_4_;
      auVar86._16_4_ = fStack_f0 * fStack_450;
      fStack_ec = auVar143._20_4_;
      auVar86._20_4_ = fStack_ec * fStack_44c;
      fStack_e8 = auVar143._24_4_;
      auVar86._24_4_ = fStack_e8 * fStack_448;
      auVar86._28_4_ = local_140._28_4_;
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      auVar134 = vsubps_avx(auVar204,auVar86);
      _local_460 = vblendvps_avx(auVar204,ZEXT832(0) << 0x20,auVar219);
      local_100 = local_100 + local_100 * auVar134._0_4_;
      fStack_fc = fStack_fc + fStack_fc * auVar134._4_4_;
      fStack_f8 = fStack_f8 + fStack_f8 * auVar134._8_4_;
      fStack_f4 = fStack_f4 + fStack_f4 * auVar134._12_4_;
      fStack_f0 = fStack_f0 + fStack_f0 * auVar134._16_4_;
      fStack_ec = fStack_ec + fStack_ec * auVar134._20_4_;
      fStack_e8 = fStack_e8 + fStack_e8 * auVar134._24_4_;
      fStack_e4 = auVar143._28_4_ + auVar134._28_4_;
      auVar87._4_4_ = fVar17 * fStack_fc;
      auVar87._0_4_ = fVar175 * local_100;
      auVar87._8_4_ = fVar162 * fStack_f8;
      auVar87._12_4_ = fVar14 * fStack_f4;
      auVar87._16_4_ = fVar25 * fStack_f0;
      auVar87._20_4_ = fVar33 * fStack_ec;
      auVar87._24_4_ = fVar40 * fStack_e8;
      auVar87._28_4_ = fStack_e4;
      local_280 = vblendvps_avx(_local_460,auVar87,auVar168);
      local_260 = ZEXT832(0) << 0x20;
      local_240._4_4_ = fVar177 + fStack_15c;
      local_240._0_4_ = fVar152 + local_160;
      fStack_238 = fVar18 + fStack_158;
      fStack_234 = fVar26 + fStack_154;
      fStack_230 = fVar34 + fStack_150;
      fStack_22c = fVar41 + fStack_14c;
      fStack_228 = fVar48 + fStack_148;
      fStack_224 = auVar205._28_4_ + fStack_144;
      local_220 = local_2e0;
      local_200 = local_300;
      uVar95 = vmovmskps_avx(local_540);
      uVar97 = (ulong)uVar95;
      auVar192 = ZEXT3264(local_3e0);
      auVar200 = ZEXT3264(local_400);
      auVar206 = ZEXT3264(local_580);
      local_580 = auVar117;
      do {
        auVar168 = auVar170._0_32_;
        auVar214 = auVar216._0_28_;
        fVar152 = auVar170._28_4_;
        uVar12 = 0;
        if (uVar97 != 0) {
          for (; (uVar97 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        pGVar9 = (pSVar93->geometries).items[*(uint *)(local_2a0 + uVar12 * 4)].ptr;
        if ((pGVar9->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar94 = true, auVar219 = auVar220._0_32_, auVar134 = auVar135._0_32_,
             auVar143 = auVar144._0_32_, auVar205 = auVar206._0_32_, auVar101 = auVar192._0_32_,
             auVar102 = auVar200._0_32_, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0095d316;
          local_5f0 = *(undefined4 *)(local_220 + uVar12 * 4);
          local_5ec = *(undefined4 *)(local_200 + uVar12 * 4);
          local_5e8 = *(undefined4 *)(local_1e0 + uVar12 * 4);
          local_5e4 = *(undefined4 *)(local_280 + uVar12 * 4);
          local_5e0 = *(undefined4 *)(local_260 + uVar12 * 4);
          local_5dc = (local_590->primIDs).field_0.i[uVar12];
          local_5d8 = *(uint *)(local_2a0 + uVar12 * 4);
          local_5d4 = context->user->instID[0];
          local_5d0 = context->user->instPrimID[0];
          ray->tfar = *(float *)(local_240 + uVar12 * 4);
          local_5fc = -1;
          local_5c0.valid = &local_5fc;
          local_5c0.geometryUserPtr = pGVar9->userPtr;
          local_5c0.context = context->user;
          local_5c0.ray = (RTCRayN *)ray;
          local_5c0.hit = (RTCHitN *)&local_5f0;
          local_5c0.N = 1;
          if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0095d25e:
            fVar152 = auVar168._28_4_;
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              auVar170 = ZEXT1664(auVar168._0_16_);
              (*p_Var11)(&local_5c0);
              fVar152 = auVar170._28_4_;
              context = local_5f8;
              if (*local_5c0.valid == 0) goto LAB_0095d2a0;
            }
            bVar94 = true;
            auVar214 = local_380._0_28_;
            auVar219 = local_420;
            auVar134 = local_3a0;
            auVar143 = local_3c0;
            auVar205 = local_580;
            auVar101 = local_3e0;
            auVar102 = local_400;
            goto LAB_0095d316;
          }
          auVar170 = ZEXT1664(auVar170._0_16_);
          (*pGVar9->occlusionFilterN)(&local_5c0);
          auVar168 = auVar170._0_32_;
          context = local_5f8;
          if (*local_5c0.valid != 0) goto LAB_0095d25e;
LAB_0095d2a0:
          ray->tfar = (float)local_1b0._0_4_;
          auVar216 = ZEXT3264(local_380);
          auVar135 = ZEXT3264(local_3a0);
          auVar144 = ZEXT3264(local_3c0);
          auVar192 = ZEXT3264(local_3e0);
          auVar200 = ZEXT3264(local_400);
          auVar206 = ZEXT3264(local_580);
          auVar220 = ZEXT3264(local_420);
          pSVar93 = local_588;
          context = local_5f8;
        }
        auVar214 = auVar216._0_28_;
        fVar152 = auVar170._28_4_;
        uVar97 = uVar97 ^ 1L << (uVar12 & 0x3f);
      } while (uVar97 != 0);
      bVar94 = false;
      auVar219 = auVar220._0_32_;
      auVar134 = auVar135._0_32_;
      auVar143 = auVar144._0_32_;
      auVar205 = auVar206._0_32_;
      auVar101 = auVar192._0_32_;
      auVar102 = auVar200._0_32_;
LAB_0095d316:
      auVar168 = vandps_avx(local_520,local_500);
      fVar98 = ray->tfar;
      auVar114._4_4_ = fVar98;
      auVar114._0_4_ = fVar98;
      auVar114._8_4_ = fVar98;
      auVar114._12_4_ = fVar98;
      auVar114._16_4_ = fVar98;
      auVar114._20_4_ = fVar98;
      auVar114._24_4_ = fVar98;
      auVar114._28_4_ = fVar98;
      auVar110 = vcmpps_avx(local_4c0,auVar114,2);
      auVar57 = auVar168 & auVar110;
      if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar57 >> 0x7f,0) == '\0') &&
            (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar57 >> 0xbf,0) == '\0') &&
          (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar57[0x1f])
      {
        return bVar94;
      }
      auVar57 = vcmpps_avx(local_4e0,local_560,0);
      auVar219 = vblendvps_avx(auVar219,local_c0,auVar57);
      auVar134 = vblendvps_avx(auVar134,local_120,auVar57);
      auVar143 = vblendvps_avx(auVar143,local_140,auVar57);
      auVar57 = vcmpps_avx(local_4e0,local_4a0,0);
      auVar58 = vcmpps_avx(local_4e0,_local_480,0);
      auVar57 = vorps_avx(auVar57,auVar58);
      fVar98 = local_4e0._0_4_;
      fVar188 = local_4e0._4_4_;
      fVar189 = local_4e0._8_4_;
      fVar162 = local_4e0._12_4_;
      fVar171 = local_4e0._16_4_;
      fVar173 = local_4e0._20_4_;
      fVar175 = local_4e0._24_4_;
      auVar155._0_4_ = (float)local_1a0._0_4_ * (auVar205._0_4_ + fVar98 * local_2c0) + local_320;
      auVar155._4_4_ = (float)local_1a0._4_4_ * (auVar205._4_4_ + fVar188 * fStack_2bc) + fStack_31c
      ;
      auVar155._8_4_ = fStack_198 * (auVar205._8_4_ + fVar189 * fStack_2b8) + fStack_318;
      auVar155._12_4_ = fStack_194 * (auVar205._12_4_ + fVar162 * fStack_2b4) + fStack_314;
      auVar155._16_4_ = fStack_190 * (auVar205._16_4_ + fVar171 * fStack_2b0) + fStack_310;
      auVar155._20_4_ = fStack_18c * (auVar205._20_4_ + fVar173 * fStack_2ac) + fStack_30c;
      auVar155._24_4_ = fStack_188 * (auVar205._24_4_ + fVar175 * fStack_2a8) + fStack_308;
      auVar155._28_4_ = auVar205._28_4_ + auVar58._28_4_ + fStack_304;
      auVar169._0_4_ =
           (float)local_1a0._0_4_ * (auVar101._0_4_ + fVar98 * (float)local_180._0_4_) + local_a0;
      auVar169._4_4_ =
           (float)local_1a0._4_4_ * (auVar101._4_4_ + fVar188 * (float)local_180._4_4_) + fStack_9c;
      auVar169._8_4_ = fStack_198 * (auVar101._8_4_ + fVar189 * fStack_178) + fStack_98;
      auVar169._12_4_ = fStack_194 * (auVar101._12_4_ + fVar162 * fStack_174) + fStack_94;
      auVar169._16_4_ = fStack_190 * (auVar101._16_4_ + fVar171 * fStack_170) + fStack_90;
      auVar169._20_4_ = fStack_18c * (auVar101._20_4_ + fVar173 * fStack_16c) + fStack_8c;
      auVar169._24_4_ = fStack_188 * (auVar101._24_4_ + fVar175 * fStack_168) + fStack_88;
      auVar169._28_4_ = auVar101._28_4_ + fVar152 + fStack_84;
      auVar187._0_4_ =
           (float)local_1a0._0_4_ * (auVar102._0_4_ + auVar214._0_4_ * fVar98) + local_e0;
      auVar187._4_4_ =
           (float)local_1a0._4_4_ * (auVar102._4_4_ + auVar214._4_4_ * fVar188) + fStack_dc;
      auVar187._8_4_ = fStack_198 * (auVar102._8_4_ + auVar214._8_4_ * fVar189) + fStack_d8;
      auVar187._12_4_ = fStack_194 * (auVar102._12_4_ + auVar214._12_4_ * fVar162) + fStack_d4;
      auVar187._16_4_ = fStack_190 * (auVar102._16_4_ + auVar214._16_4_ * fVar171) + fStack_d0;
      auVar187._20_4_ = fStack_18c * (auVar102._20_4_ + auVar214._20_4_ * fVar173) + fStack_cc;
      auVar187._24_4_ = fStack_188 * (auVar102._24_4_ + auVar214._24_4_ * fVar175) + fStack_c8;
      auVar187._28_4_ = auVar102._28_4_ + local_4e0._28_4_ + fStack_c4;
      auVar88._4_4_ = (float)local_440._4_4_ * fStack_35c;
      auVar88._0_4_ = (float)local_440._0_4_ * local_360;
      auVar88._8_4_ = fStack_438 * fStack_358;
      auVar88._12_4_ = fStack_434 * fStack_354;
      auVar88._16_4_ = fStack_430 * fStack_350;
      auVar88._20_4_ = fStack_42c * fStack_34c;
      auVar88._24_4_ = fStack_428 * fStack_348;
      auVar88._28_4_ = uStack_184;
      auVar205 = vsubps_avx(auVar155,auVar88);
      auVar89._4_4_ = (float)local_440._4_4_ * fStack_7c;
      auVar89._0_4_ = (float)local_440._0_4_ * local_80;
      auVar89._8_4_ = fStack_438 * fStack_78;
      auVar89._12_4_ = fStack_434 * fStack_74;
      auVar89._16_4_ = fStack_430 * fStack_70;
      auVar89._20_4_ = fStack_42c * fStack_6c;
      auVar89._24_4_ = fStack_428 * fStack_68;
      auVar89._28_4_ = uStack_184;
      auVar101 = vsubps_avx(auVar169,auVar89);
      auVar90._4_4_ = (float)local_440._4_4_ * fStack_33c;
      auVar90._0_4_ = (float)local_440._0_4_ * local_340;
      auVar90._8_4_ = fStack_438 * fStack_338;
      auVar90._12_4_ = fStack_434 * fStack_334;
      auVar90._16_4_ = fStack_430 * fStack_330;
      auVar90._20_4_ = fStack_42c * fStack_32c;
      auVar90._24_4_ = fStack_428 * fStack_328;
      auVar90._28_4_ = uStack_184;
      auVar102 = vsubps_avx(auVar187,auVar90);
      local_220 = vblendvps_avx(auVar219,auVar205,auVar57);
      local_200 = vblendvps_avx(auVar134,auVar101,auVar57);
      local_1e0 = vblendvps_avx(auVar143,auVar102,auVar57);
      auVar91._4_4_ = (float)local_440._4_4_ * fStack_fc;
      auVar91._0_4_ = (float)local_440._0_4_ * local_100;
      auVar91._8_4_ = fStack_438 * fStack_f8;
      auVar91._12_4_ = fStack_434 * fStack_f4;
      auVar91._16_4_ = fStack_430 * fStack_f0;
      auVar91._20_4_ = fStack_42c * fStack_ec;
      auVar91._24_4_ = fStack_428 * fStack_e8;
      auVar91._28_4_ = auVar205._28_4_;
      local_280 = vblendvps_avx(_local_460,auVar91,auVar57);
      auVar168 = vandps_avx(auVar110,auVar168);
      local_260 = ZEXT832(0) << 0x20;
      _local_240 = local_4c0;
      uVar96 = vmovmskps_avx(auVar168);
      uVar97 = CONCAT44((int)(uVar97 >> 0x20),uVar96);
      pSVar93 = context->scene;
      do {
        local_5c0.hit = (RTCHitN *)&local_5f0;
        local_5c0.valid = &local_5fc;
        uVar12 = 0;
        if (uVar97 != 0) {
          for (; (uVar97 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        pGVar9 = (pSVar93->geometries).items[*(uint *)(local_2a0 + uVar12 * 4)].ptr;
        if ((pGVar9->mask & ray->mask) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar92 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0095d631;
          local_5f0 = *(undefined4 *)(local_220 + uVar12 * 4);
          local_5ec = *(undefined4 *)(local_200 + uVar12 * 4);
          local_5e8 = *(undefined4 *)(local_1e0 + uVar12 * 4);
          local_5e4 = *(undefined4 *)(local_280 + uVar12 * 4);
          local_5e0 = *(undefined4 *)(local_260 + uVar12 * 4);
          local_5dc = (local_590->primIDs).field_0.i[uVar12];
          local_5d8 = *(uint *)(local_2a0 + uVar12 * 4);
          local_5d4 = context->user->instID[0];
          local_5d0 = context->user->instPrimID[0];
          local_580._0_4_ = ray->tfar;
          ray->tfar = *(float *)(local_240 + uVar12 * 4);
          local_5fc = -1;
          local_5c0.geometryUserPtr = pGVar9->userPtr;
          local_5c0.context = context->user;
          local_560._0_8_ = ray;
          local_5c0.N = 1;
          local_5c0.ray = (RTCRayN *)ray;
          if ((pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar9->occlusionFilterN)(&local_5c0), context = local_5f8, *local_5c0.valid != 0))
          {
            p_Var11 = context->args->filter;
            if ((p_Var11 == (RTCFilterFunctionN)0x0) ||
               ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar9->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var11)(&local_5c0), *local_5c0.valid != 0)))) {
              bVar92 = 1;
              goto LAB_0095d631;
            }
          }
          *(undefined4 *)(local_560._0_8_ + 0x20) = local_580._0_4_;
          context = local_5f8;
          ray = (Ray *)local_560._0_8_;
        }
        uVar97 = uVar97 ^ 1L << (uVar12 & 0x3f);
        if (uVar97 == 0) {
          bVar92 = 0;
LAB_0095d631:
          return (bool)(bVar94 | bVar92);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }